

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O0

void crnlib::etc1_block::get_abs_subblock_colors
               (color_quad_u8 *pDst,uint16 packed_color4,uint table_idx)

{
  int iVar1;
  int y3;
  int y2;
  int y1;
  int y0;
  int ib;
  int ig;
  int ir;
  uint b;
  uint g;
  uint r;
  int *pInten_modifer_table;
  uint table_idx_local;
  uint16 packed_color4_local;
  color_quad_u8 *pDst_local;
  
  _g = (int *)(g_etc1_inten_tables + (ulong)table_idx * 0x10);
  pInten_modifer_table._0_4_ = table_idx;
  pInten_modifer_table._6_2_ = packed_color4;
  _table_idx_local = pDst;
  unpack_color4(&b,(uint *)&ir,(uint *)&ig,packed_color4,true);
  iVar1 = *_g;
  color_quad<unsigned_char,_int>::set(_table_idx_local,b + iVar1,ir + iVar1,ig + iVar1,0xff);
  iVar1 = _g[1];
  color_quad<unsigned_char,_int>::set(_table_idx_local + 1,b + iVar1,ir + iVar1,ig + iVar1,0xff);
  iVar1 = _g[2];
  color_quad<unsigned_char,_int>::set(_table_idx_local + 2,b + iVar1,ir + iVar1,ig + iVar1,0xff);
  iVar1 = _g[3];
  color_quad<unsigned_char,_int>::set(_table_idx_local + 3,b + iVar1,ir + iVar1,ig + iVar1,0xff);
  return;
}

Assistant:

void etc1_block::get_abs_subblock_colors(color_quad_u8* pDst, uint16 packed_color4, uint table_idx)
    {
        CRNLIB_ASSERT(table_idx < cETC1IntenModifierValues);
        const int* pInten_modifer_table = &g_etc1_inten_tables[table_idx][0];

        uint r, g, b;
        unpack_color4(r, g, b, packed_color4, true);

        const int ir = static_cast<int>(r), ig = static_cast<int>(g), ib = static_cast<int>(b);

        const int y0 = pInten_modifer_table[0];
        pDst[0].set(ir + y0, ig + y0, ib + y0);

        const int y1 = pInten_modifer_table[1];
        pDst[1].set(ir + y1, ig + y1, ib + y1);

        const int y2 = pInten_modifer_table[2];
        pDst[2].set(ir + y2, ig + y2, ib + y2);

        const int y3 = pInten_modifer_table[3];
        pDst[3].set(ir + y3, ig + y3, ib + y3);
    }